

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kmip.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Kmip::generateCredential
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Kmip *this,Path *scope,Path *role,Parameters *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client *client;
  long *plVar2;
  size_type *psVar3;
  ulong *puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_d0;
  Path local_b0;
  string local_90;
  Url local_70;
  string local_50;
  
  client = *(Client **)this;
  Vault::operator+(&local_50,"scope/",scope);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_d0.field_2._M_allocated_capacity = *psVar3;
    local_d0.field_2._8_8_ = plVar2[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar3;
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  Vault::operator+(&local_90,&local_d0,role);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4) {
    local_e0._M_allocated_capacity = *puVar4;
    local_e0._8_8_ = plVar2[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0._M_allocated_capacity = *puVar4;
    local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar2;
  }
  local_b0.value_._M_string_length = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  paVar1 = &local_b0.value_.field_2;
  if (local_f0 == &local_e0) {
    local_b0.value_.field_2._8_8_ = local_e0._8_8_;
    local_b0.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.value_._M_dataplus._M_p = (pointer)local_f0;
  }
  local_b0.value_.field_2._M_allocated_capacity = local_e0._M_allocated_capacity;
  local_e0._M_allocated_capacity = local_e0._M_allocated_capacity & 0xffffffffffffff00;
  getUrl(&local_70,this,&local_b0);
  HttpConsumer::post(__return_storage_ptr__,client,&local_70,parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value_._M_dataplus._M_p != &local_70.value_.field_2) {
    operator_delete(local_70.value_._M_dataplus._M_p,
                    local_70.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0.value_._M_dataplus._M_p,
                    local_b0.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Kmip::generateCredential(const Path &scope, const Path &role,
                                const Parameters &parameters) {
  return HttpConsumer::post(
      client_,
      getUrl(Path{"scope/" + scope + "/role/" + role + "/credential/generate"}),
      parameters);
}